

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

void mod2sparse_transpose(mod2sparse *m,mod2sparse *r)

{
  mod2entry *pmVar1;
  char *__ptr;
  long lVar2;
  size_t sStack_30;
  
  if ((m->n_rows == r->n_cols) && (m->n_cols == r->n_rows)) {
    if (r != m) {
      mod2sparse_clear(r);
      for (lVar2 = 0; lVar2 < m->n_rows; lVar2 = lVar2 + 1) {
        pmVar1 = m->rows + lVar2;
        while (pmVar1 = pmVar1->right, -1 < pmVar1->row) {
          mod2sparse_insert(r,pmVar1->col,(int)lVar2);
        }
      }
      return;
    }
    __ptr = "mod2sparse_transpose: Result matrix is the same as the operand\n";
    sStack_30 = 0x3f;
  }
  else {
    __ptr = "mod2sparse_transpose: Matrices have incompatible dimensions\n";
    sStack_30 = 0x3c;
  }
  fwrite(__ptr,sStack_30,1,_stderr);
  exit(1);
}

Assistant:

void mod2sparse_transpose
( mod2sparse *m,	/* Matrix to compute transpose of (left unchanged) */
  mod2sparse *r		/* Result of transpose operation */
)
{
  mod2entry *e;
  int i;

  if (mod2sparse_rows(m)!=mod2sparse_cols(r) 
   || mod2sparse_cols(m)!=mod2sparse_rows(r))
  { fprintf(stderr,
     "mod2sparse_transpose: Matrices have incompatible dimensions\n");
    exit(1);
  }

  if (r==m)
  { fprintf(stderr, 
     "mod2sparse_transpose: Result matrix is the same as the operand\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(m); i++)
  {
    e = mod2sparse_first_in_row(m,i);

    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,mod2sparse_col(e),i);
      e = mod2sparse_next_in_row(e);
    }
  }
}